

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O2

pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>_> * __thiscall
spvtools::opt::TrimCapabilitiesPass::DetermineRequiredCapabilitiesAndExtensions
          (pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>_>
           *__return_storage_ptr__,TrimCapabilitiesPass *this)

{
  Module *this_00;
  bool bVar1;
  Capability CVar2;
  long lVar3;
  iterator __begin2;
  CapabilitySet required_capabilities;
  ExtensionSet required_extensions;
  
  EnumSet<spv::Capability>::EnumSet(&required_capabilities);
  EnumSet<spvtools::Extension>::EnumSet(&required_extensions);
  this_00 = (((this->super_Pass).context_)->module_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  __begin2.bucketIndex_ = 0;
  __begin2.set_ = (EnumSet<spv::Capability> *)::operator_new(0x18);
  ((__begin2.set_)->buckets_).
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
  ((__begin2.set_)->buckets_).
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&required_capabilities;
  ((__begin2.set_)->buckets_).
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&required_extensions;
  __begin2._16_8_ =
       std::
       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:626:29)>
       ::_M_manager;
  Module::ForEachInst(this_00,(function<void_(spvtools::opt::Instruction_*)> *)&__begin2,false);
  if (__begin2._16_8_ != 0) {
    (*(code *)__begin2._16_8_)(&__begin2,&__begin2,3);
  }
  EnumSet<spv::Capability>::cbegin(&__begin2,&required_capabilities);
  lVar3 = (long)required_capabilities.buckets_.
                super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)required_capabilities.buckets_.
                super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_start;
  while (((__begin2.set_ != &required_capabilities || (__begin2.bucketOffset_ != 0)) ||
         (__begin2.bucketIndex_ != lVar3 >> 4))) {
    CVar2 = EnumSet<spv::Capability>::Iterator::operator*(&__begin2);
    AddExtensionsForOperand(this,SPV_OPERAND_TYPE_CAPABILITY,CVar2,&required_extensions);
    EnumSet<spv::Capability>::Iterator::operator++(&__begin2);
  }
  EnumSet<spv::Capability>::cbegin(&__begin2,&required_capabilities);
  while (((__begin2.set_ != &required_capabilities || (__begin2.bucketOffset_ != 0)) ||
         (__begin2.bucketIndex_ !=
          (long)required_capabilities.buckets_.
                super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)required_capabilities.buckets_.
                super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4))) {
    CVar2 = EnumSet<spv::Capability>::Iterator::operator*(&__begin2);
    bVar1 = EnumSet<spv::Capability>::contains(&this->supportedCapabilities_,CVar2);
    if (!bVar1) {
      __assert_fail("supportedCapabilities_.contains(capability) && \"Module is using a capability that is not listed as supported.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                    ,0x287,
                    "std::pair<CapabilitySet, ExtensionSet> spvtools::opt::TrimCapabilitiesPass::DetermineRequiredCapabilitiesAndExtensions() const"
                   );
    }
    EnumSet<spv::Capability>::Iterator::operator++(&__begin2);
  }
  std::pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>_>::
  pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>,_true>
            (__return_storage_ptr__,&required_capabilities,&required_extensions);
  std::
  _Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ::~_Vector_base((_Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                   *)&required_extensions);
  std::
  _Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ::~_Vector_base((_Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                   *)&required_capabilities);
  return __return_storage_ptr__;
}

Assistant:

std::pair<CapabilitySet, ExtensionSet>
TrimCapabilitiesPass::DetermineRequiredCapabilitiesAndExtensions() const {
  CapabilitySet required_capabilities;
  ExtensionSet required_extensions;

  get_module()->ForEachInst([&](Instruction* instruction) {
    addInstructionRequirements(instruction, &required_capabilities,
                               &required_extensions);
  });

  for (auto capability : required_capabilities) {
    AddExtensionsForOperand(SPV_OPERAND_TYPE_CAPABILITY,
                            static_cast<uint32_t>(capability),
                            &required_extensions);
  }

#if !defined(NDEBUG)
  // Debug only. We check the outputted required capabilities against the
  // supported capabilities list. The supported capabilities list is useful for
  // API users to quickly determine if they can use the pass or not. But this
  // list has to remain up-to-date with the pass code. If we can detect a
  // capability as required, but it's not listed, it means the list is
  // out-of-sync. This method is not ideal, but should cover most cases.
  {
    for (auto capability : required_capabilities) {
      assert(supportedCapabilities_.contains(capability) &&
             "Module is using a capability that is not listed as supported.");
    }
  }
#endif

  return std::make_pair(std::move(required_capabilities),
                        std::move(required_extensions));
}